

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

BinaryOp __thiscall
wasm::Random::pick<wasm::BinaryOp>(Random *this,FeatureOptions<wasm::BinaryOp> *picker)

{
  BinaryOp BVar1;
  value_type *pvVar2;
  vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_> local_30;
  
  items<wasm::BinaryOp>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>>>(this,&local_30);
  BVar1 = *pvVar2;
  if (local_30.super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return BVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }